

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_complexity_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  Alloc *pAVar1;
  LO nmetrics;
  uint uVar2;
  Int IVar3;
  ulong uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  Write<double> *this_00;
  Reals RVar6;
  allocator local_a9;
  Write<double> local_a8;
  Write<double> local_98;
  Write<double> local_88;
  Write<double> local_78;
  Write<double> local_68;
  Write<double> local_58;
  string local_48;
  
  pAVar1 = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar4 = pAVar1->size;
  }
  else {
    uVar4 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar4 >> 3) == 0) {
    std::__cxx11::string::string((string *)&local_48,"",&local_a9);
    Read<double>::Read((Read<double> *)this,(initializer_list<double>)ZEXT816(0),&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pvVar5 = extraout_RDX;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    Write<double>::Write(&local_58,&v2m->write_);
    uVar2 = get_metrics_dim(nmetrics,(Reals *)&local_58);
    Write<double>::~Write(&local_58);
    IVar3 = Mesh::dim(mesh);
    if (uVar2 == 3 && IVar3 == 3) {
      Write<double>::Write(&local_68,&v2m->write_);
      get_complexity_per_elem_tmpl<3,3>(this,mesh,(Reals *)&local_68);
      this_00 = &local_68;
    }
    else {
      IVar3 = Mesh::dim(mesh);
      if (uVar2 == 2 && IVar3 == 2) {
        Write<double>::Write(&local_78,&v2m->write_);
        get_complexity_per_elem_tmpl<2,2>(this,mesh,(Reals *)&local_78);
        this_00 = &local_78;
      }
      else {
        IVar3 = Mesh::dim(mesh);
        if (IVar3 == 3 && (uVar2 ^ 1) == 0) {
          Write<double>::Write(&local_88,&v2m->write_);
          get_complexity_per_elem_tmpl<3,1>(this,mesh,(Reals *)&local_88);
          this_00 = &local_88;
        }
        else {
          IVar3 = Mesh::dim(mesh);
          if ((uVar2 ^ 1) == 0 && IVar3 == 2) {
            Write<double>::Write(&local_98,&v2m->write_);
            get_complexity_per_elem_tmpl<2,1>(this,mesh,(Reals *)&local_98);
            this_00 = &local_98;
          }
          else {
            IVar3 = Mesh::dim(mesh);
            if (IVar3 != 1) {
              fail("assertion %s failed at %s +%d\n","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
                   ,0x1f2);
            }
            Write<double>::Write(&local_a8,&v2m->write_);
            get_complexity_per_elem_tmpl<1,1>(this,mesh,(Reals *)&local_a8);
            this_00 = &local_a8;
          }
        }
      }
    }
    Write<double>::~Write(this_00);
    pvVar5 = extraout_RDX_00;
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals get_complexity_per_elem(Mesh* mesh, Reals v2m) {
  if (v2m.size() == 0) return Reals({});
  auto metric_dim = get_metrics_dim(mesh->nverts(), v2m);
  if (mesh->dim() == 3 && metric_dim == 3) {
    return get_complexity_per_elem_tmpl<3, 3>(mesh, v2m);
  } else if (mesh->dim() == 2 && metric_dim == 2) {
    return get_complexity_per_elem_tmpl<2, 2>(mesh, v2m);
  } else if (mesh->dim() == 3 && metric_dim == 1) {
    return get_complexity_per_elem_tmpl<3, 1>(mesh, v2m);
  } else if (mesh->dim() == 2 && metric_dim == 1) {
    return get_complexity_per_elem_tmpl<2, 1>(mesh, v2m);
  } else if (mesh->dim() == 1) {
    return get_complexity_per_elem_tmpl<1, 1>(mesh, v2m);
  }
  OMEGA_H_NORETURN(Reals());
}